

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attribute_octahedron_transform.cc
# Opt level: O2

bool __thiscall
draco::AttributeOctahedronTransform::GeneratePortableAttribute
          (AttributeOctahedronTransform *this,PointAttribute *attribute,
          vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
          *point_ids,int num_points,PointAttribute *target_attribute)

{
  size_t sVar1;
  bool bVar2;
  uint uVar3;
  pointer pIVar4;
  pointer pIVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  int32_t t;
  int32_t s;
  float att_val [3];
  OctahedronToolBox converter;
  int32_t local_58;
  int32_t local_54;
  float local_50 [3];
  OctahedronToolBox local_44;
  
  lVar8 = (target_attribute->super_GeometryAttribute).byte_offset_;
  lVar6 = (long)(((target_attribute->super_GeometryAttribute).buffer_)->data_).
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  local_44.quantization_bits_ = -1;
  local_44.max_quantized_value_ = -1;
  local_44.max_value_ = -1;
  local_44.dequantization_scale_ = 1.0;
  local_44.center_value_ = -1;
  bVar2 = OctahedronToolBox::SetQuantizationBits(&local_44,this->quantization_bits_);
  if (bVar2) {
    pIVar4 = (point_ids->
             super__Vector_base<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pIVar5 = (point_ids->
             super__Vector_base<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (pIVar4 == pIVar5) {
      lVar8 = lVar8 + lVar6;
      for (uVar7 = 0; (uint)num_points != uVar7; uVar7 = uVar7 + 1) {
        if (attribute->identity_mapping_ == true) {
          uVar3 = (uint)uVar7;
        }
        else {
          uVar3 = (attribute->indices_map_).vector_.
                  super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar7].value_;
        }
        sVar1 = (attribute->super_GeometryAttribute).byte_stride_;
        memcpy(local_50,(void *)((long)(((attribute->super_GeometryAttribute).buffer_)->data_).
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start +
                                 (attribute->super_GeometryAttribute).byte_offset_ + uVar3 * sVar1),
               sVar1);
        OctahedronToolBox::FloatVectorToQuantizedOctahedralCoords<float>
                  (&local_44,local_50,&local_54,&local_58);
        *(int32_t *)(lVar8 + uVar7 * 8) = local_54;
        *(int32_t *)(lVar8 + 4 + uVar7 * 8) = local_58;
      }
    }
    else {
      lVar6 = lVar6 + lVar8;
      for (uVar7 = 0; (uVar7 & 0xffffffff) < (ulong)((long)pIVar5 - (long)pIVar4 >> 2);
          uVar7 = uVar7 + 1) {
        uVar3 = pIVar4[uVar7 & 0xffffffff].value_;
        if (attribute->identity_mapping_ == false) {
          uVar3 = (attribute->indices_map_).vector_.
                  super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar3].value_;
        }
        sVar1 = (attribute->super_GeometryAttribute).byte_stride_;
        memcpy(local_50,(void *)((long)(((attribute->super_GeometryAttribute).buffer_)->data_).
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start +
                                 (attribute->super_GeometryAttribute).byte_offset_ + uVar3 * sVar1),
               sVar1);
        OctahedronToolBox::FloatVectorToQuantizedOctahedralCoords<float>
                  (&local_44,local_50,&local_54,&local_58);
        *(int32_t *)(lVar6 + uVar7 * 8) = local_54;
        *(int32_t *)(lVar6 + 4 + uVar7 * 8) = local_58;
        pIVar4 = (point_ids->
                 super__Vector_base<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        pIVar5 = (point_ids->
                 super__Vector_base<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      }
    }
  }
  return bVar2;
}

Assistant:

bool AttributeOctahedronTransform::GeneratePortableAttribute(
    const PointAttribute &attribute, const std::vector<PointIndex> &point_ids,
    int num_points, PointAttribute *target_attribute) const {
  DRACO_DCHECK(is_initialized());

  // Quantize all values in the order given by point_ids into portable
  // attribute.
  int32_t *const portable_attribute_data = reinterpret_cast<int32_t *>(
      target_attribute->GetAddress(AttributeValueIndex(0)));
  float att_val[3];
  int32_t dst_index = 0;
  OctahedronToolBox converter;
  if (!converter.SetQuantizationBits(quantization_bits_)) {
    return false;
  }
  if (!point_ids.empty()) {
    for (uint32_t i = 0; i < point_ids.size(); ++i) {
      const AttributeValueIndex att_val_id =
          attribute.mapped_index(point_ids[i]);
      attribute.GetValue(att_val_id, att_val);
      // Encode the vector into a s and t octahedral coordinates.
      int32_t s, t;
      converter.FloatVectorToQuantizedOctahedralCoords(att_val, &s, &t);
      portable_attribute_data[dst_index++] = s;
      portable_attribute_data[dst_index++] = t;
    }
  } else {
    for (PointIndex i(0); i < num_points; ++i) {
      const AttributeValueIndex att_val_id = attribute.mapped_index(i);
      attribute.GetValue(att_val_id, att_val);
      // Encode the vector into a s and t octahedral coordinates.
      int32_t s, t;
      converter.FloatVectorToQuantizedOctahedralCoords(att_val, &s, &t);
      portable_attribute_data[dst_index++] = s;
      portable_attribute_data[dst_index++] = t;
    }
  }

  return true;
}